

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
UnaryExpr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*const_&>::
streamReconstructedExpression
          (UnaryExpr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*const_&>
           *this,ostream *os)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  StringMaker<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,void>::
  convert<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (in_stack_ffffffffffffffc8);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }